

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

ConditionalDirectiveExpressionSyntax * __thiscall
slang::parsing::Preprocessor::parseConditionalExpr(Preprocessor *this)

{
  uint uVar1;
  ConditionalDirectiveExpressionSyntax *pCVar2;
  BinaryConditionalDirectiveExpressionSyntax *args;
  Token TVar3;
  anon_class_8_1_8991fb9c parsePrimary;
  Token op;
  anon_class_8_1_8991fb9c local_38;
  Token local_30;
  
  local_38.this = this;
  TVar3 = peek(this);
  if (TVar3.kind == Exclamation) {
    local_30 = consume(this);
    pCVar2 = parseConditionalExpr::anon_class_8_1_8991fb9c::operator()(&local_38);
    args = (BinaryConditionalDirectiveExpressionSyntax *)
           BumpAllocator::
           emplace<slang::syntax::UnaryConditionalDirectiveExpressionSyntax,slang::parsing::Token&,slang::syntax::ConditionalDirectiveExpressionSyntax&>
                     (this->alloc,&local_30,pCVar2);
  }
  else {
    args = (BinaryConditionalDirectiveExpressionSyntax *)
           parseConditionalExpr::anon_class_8_1_8991fb9c::operator()(&local_38);
  }
  while( true ) {
    TVar3 = peek(this);
    uVar1 = TVar3.kind - 0x26;
    if ((0x34 < uVar1) || ((0x10440000000001U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) break;
    local_30 = consume(this);
    pCVar2 = parseConditionalExpr(this);
    args = BumpAllocator::
           emplace<slang::syntax::BinaryConditionalDirectiveExpressionSyntax,slang::syntax::ConditionalDirectiveExpressionSyntax&,slang::parsing::Token&,slang::syntax::ConditionalDirectiveExpressionSyntax&>
                     (this->alloc,&args->super_ConditionalDirectiveExpressionSyntax,&local_30,pCVar2
                     );
  }
  return &args->super_ConditionalDirectiveExpressionSyntax;
}

Assistant:

ConditionalDirectiveExpressionSyntax* Preprocessor::parseConditionalExpr() {
    auto isBinaryOp = [](TokenKind kind) {
        switch (kind) {
            case TokenKind::DoubleAnd:
            case TokenKind::DoubleOr:
            case TokenKind::MinusArrow:
            case TokenKind::LessThanMinusArrow:
                return true;
            default:
                return false;
        }
    };

    auto parsePrimary = [&]() -> ConditionalDirectiveExpressionSyntax* {
        Token token = peek();
        if (token.kind == TokenKind::OpenParenthesis) {
            auto openParen = consume();
            auto operand = parseConditionalExpr();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            return alloc.emplace<ParenthesizedConditionalDirectiveExpressionSyntax>(openParen,
                                                                                    *operand,
                                                                                    closeParen);
        }
        else {
            auto id = expect(TokenKind::Identifier);
            return alloc.emplace<NamedConditionalDirectiveExpressionSyntax>(id);
        }
    };

    ConditionalDirectiveExpressionSyntax* left;
    if (peek(TokenKind::Exclamation)) {
        auto op = consume();
        auto operand = parsePrimary();
        left = alloc.emplace<UnaryConditionalDirectiveExpressionSyntax>(op, *operand);
    }
    else {
        left = parsePrimary();
    }

    while (true) {
        if (!isBinaryOp(peek().kind))
            break;

        auto op = consume();
        auto right = parseConditionalExpr();
        left = alloc.emplace<BinaryConditionalDirectiveExpressionSyntax>(*left, op, *right);
    }

    return left;
}